

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O2

void __thiscall
libtorrent::session_handle::apply_settings
          (session_handle *this,
          vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> *s)

{
  shared_ptr<libtorrent::settings_pack> copy;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  ::std::make_shared<libtorrent::settings_pack,libtorrent::settings_pack>
            ((vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> *)
             &stack0xffffffffffffffe0);
  async_call<void(libtorrent::aux::session_impl::*)(std::shared_ptr<libtorrent::settings_pack>),std::shared_ptr<libtorrent::settings_pack>&>
            (this,0x169,(shared_ptr<libtorrent::settings_pack> *)0x0);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

void session_handle::apply_settings(settings_pack&& s)
	{
		TORRENT_ASSERT_PRECOND(!s.has_val(settings_pack::out_enc_policy)
			|| s.get_int(settings_pack::out_enc_policy)
				<= settings_pack::pe_disabled);
		TORRENT_ASSERT_PRECOND(!s.has_val(settings_pack::in_enc_policy)
			|| s.get_int(settings_pack::in_enc_policy)
				<= settings_pack::pe_disabled);
		TORRENT_ASSERT_PRECOND(!s.has_val(settings_pack::allowed_enc_level)
			|| s.get_int(settings_pack::allowed_enc_level)
				<= settings_pack::pe_both);

		auto copy = std::make_shared<settings_pack>(std::move(s));
		async_call(&session_impl::apply_settings_pack, copy);
	}